

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextGLImpl::WaitForIdle(DeviceContextGLImpl *this)

{
  string msg;
  string local_30;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_Desc.IsDeferred == true) {
    FormatString<char[37]>(&local_30,(char (*) [37])"Only immediate contexts can be idled");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x633);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  Flush(this);
  glFinish();
  return;
}

Assistant:

void DeviceContextGLImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    glFinish();
}